

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void EV_StartLightStrobing(int tag,int utics,int ltics)

{
  sector_t_conflict *psVar1;
  uint uVar2;
  DSectorEffect *pDVar3;
  DStrobe *this;
  FSectorTagIterator it;
  
  if (tag == 0) {
    it.start = 0;
  }
  else {
    it.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  it.searchtag = tag;
  while( true ) {
    uVar2 = FSectorTagIterator::Next(&it);
    psVar1 = sectors;
    if ((int)uVar2 < 0) break;
    pDVar3 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&sectors[uVar2].lightingdata);
    if (pDVar3 == (DSectorEffect *)0x0) {
      this = (DStrobe *)DObject::operator_new(0x58);
      DStrobe::DStrobe(this,(sector_t *)(psVar1 + uVar2),utics,ltics,false);
    }
  }
  return;
}

Assistant:

void EV_StartLightStrobing (int tag, int utics, int ltics)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;
		
		new DStrobe (sec, utics, ltics, false);
	}
}